

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments
          (ConversionStream *this,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,stringstream *ReturnHandlerSS,String *Prologue)

{
  anon_class_32_4_2db97311 ArgHandler;
  anon_class_40_5_5db09250 ArgHandler_00;
  String *this_00;
  bool bVar1;
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  ConversionStream *local_580;
  String *pSStack_578;
  undefined1 *local_570;
  stringstream *psStack_568;
  ConversionStream *local_560;
  stringstream *psStack_558;
  __node_base_ptr *local_550;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  **ppvStack_548;
  stringstream *local_540;
  reference local_538;
  ShaderParameterInfo *Param;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *__range1;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  LocationToSemantic;
  int AutoInputLocation;
  int OutLocation;
  stringstream InterfaceVarsSS;
  stringstream local_340 [8];
  stringstream PrologueSS;
  stringstream local_1b8 [8];
  stringstream GlobalVarsSS;
  ostream local_1a8 [376];
  String *local_30;
  String *Prologue_local;
  stringstream *ReturnHandlerSS_local;
  String *GlobalVariables_local;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *Params_local;
  ConversionStream *this_local;
  
  local_30 = Prologue;
  Prologue_local = (String *)ReturnHandlerSS;
  ReturnHandlerSS_local = (stringstream *)GlobalVariables;
  GlobalVariables_local = (String *)Params;
  Params_local = (vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  *)this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream((stringstream *)&AutoInputLocation);
  LocationToSemantic._M_h._M_single_bucket._4_4_ = 0;
  LocationToSemantic._M_h._M_single_bucket._0_4_ = 0;
  std::
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  ::unordered_map((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                   *)&__range1);
  this_00 = GlobalVariables_local;
  __end1 = std::
           vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           ::begin((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    *)GlobalVariables_local);
  Param = (ShaderParameterInfo *)
          std::
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          ::end((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                                     *)&Param), bVar1) {
    local_538 = __gnu_cxx::
                __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                ::operator*(&__end1);
    if (local_538->storageQualifier == In) {
      psStack_558 = (stringstream *)local_340;
      local_550 = &LocationToSemantic._M_h._M_single_bucket;
      ppvStack_548 = &__range1;
      local_540 = (stringstream *)local_1b8;
      ArgHandler_00.PrologueSS = psStack_558;
      ArgHandler_00.this = this;
      ArgHandler_00.AutoInputLocation = (int *)local_550;
      ArgHandler_00.LocationToSemantic =
           (unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
            *)ppvStack_548;
      ArgHandler_00.GlobalVarsSS = local_540;
      local_560 = this;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments(std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>&,std::__cxx11::string&,std::__cxx11::stringstream&,std::__cxx11::string&)::__0>
                (this,local_538,0,0,psStack_558,ArgHandler_00);
    }
    else if ((local_538->storageQualifier == Out) || (local_538->storageQualifier == Ret)) {
      pSStack_578 = Prologue_local;
      local_570 = (undefined1 *)((long)&LocationToSemantic._M_h._M_single_bucket + 4);
      psStack_568 = (stringstream *)&AutoInputLocation;
      ArgHandler.ReturnHandlerSS = (stringstream *)Prologue_local;
      ArgHandler.this = this;
      ArgHandler.OutLocation = (int *)local_570;
      ArgHandler.InterfaceVarsSS = psStack_568;
      local_580 = this;
      ProcessShaderArgument<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments(std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>&,std::__cxx11::string&,std::__cxx11::stringstream&,std::__cxx11::string&)::__1>
                (this,local_538,0,1,(stringstream *)local_340,ArgHandler);
    }
    __gnu_cxx::
    __normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::operator<<(local_1a8,local_5a0);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)ReturnHandlerSS_local,local_5c0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_30,local_5e0);
  std::__cxx11::string::~string(local_5e0);
  std::
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  ::~unordered_map((unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                    *)&__range1);
  std::__cxx11::stringstream::~stringstream((stringstream *)&AutoInputLocation);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments(std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           GlobalVariables,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS, InterfaceVarsSS;
    int          OutLocation       = 0;
    int          AutoInputLocation = 0; // Automatically assigned input location

    std::unordered_map<int, const Char*> LocationToSemantic;
    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, VSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (!Getter.empty())
                        PrologueSS << "    " << Getter << '(' << FullParamName << ");\n";
                    else
                    {
                        int         InputLocation  = AutoInputLocation;
                        const auto& Semantic       = Param.Semantic;
                        auto        SemanticEndPos = Semantic.begin();
                        if (Parsing::SkipString(SemanticEndPos, Semantic.end(), "attrib", SemanticEndPos))
                        {
                            char* EndPtr    = nullptr;
                            auto  AttribInd = static_cast<int>(strtol(&*SemanticEndPos, &EndPtr, 10));
                            if (EndPtr != nullptr && *EndPtr == 0)
                            {
                                InputLocation     = AttribInd;
                                AutoInputLocation = InputLocation;
                            }
                        }
                        auto it = LocationToSemantic.find(InputLocation);
                        if (it != LocationToSemantic.end())
                        {
                            LOG_ERROR_AND_THROW("Location ", InputLocation, " assigned to semantic \"", Semantic, "\" conflicts with previous semantic \"", it->second, "\". Please use ATTRIB* semantic to explicitly specify attribute index");
                        }
                        LocationToSemantic[InputLocation] = Semantic.c_str();
                        auto InputVarName                 = BuildParameterName(MemberStack, '_', "_vsin_");
                        // Interpolation qualifiers are not allowed on VS inputs.
                        const char* Interpolation = nullptr;
                        // Layout location qualifiers are allowed on VS inputs even in GLES3.0.
                        DefineInterfaceVar(InputLocation, Interpolation, "in", Param.Type, InputVarName, GlobalVarsSS);
                        InitVariable(FullParamName, InputVarName, PrologueSS);
                        AutoInputLocation++;
                    }
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                Param, VSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (!Setter.empty())
                        ReturnHandlerSS << Setter << '(' << FullParamName << ");\\\n";
                    else
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_vsout_" : "_");
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? OutLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsSS);
                        ReturnHandlerSS << OutputVarName << " = " << FullParamName << ";\\\n";
                    }
                } //
            );
        }
    }

    GlobalVarsSS << InterfaceVarsSS.str();
    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}